

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O0

void __thiscall CMU462::Application::executeFileOp(Application *this,int codepoint)

{
  Application *this_00;
  ostream *filename_00;
  undefined4 in_ESI;
  long in_RDI;
  stringstream filename;
  int index;
  string local_1e8 [32];
  string local_1c8 [48];
  stringstream local_198 [16];
  ostream local_188 [352];
  char *in_stack_ffffffffffffffd8;
  Application *in_stack_ffffffffffffffe0;
  int local_10;
  
  if (((*(byte *)(in_RDI + 0x469) & 1) != 0) || ((*(byte *)(in_RDI + 0x468) & 1) != 0)) {
    switch(in_ESI) {
    case 0x30:
      local_10 = 0;
      break;
    case 0x31:
      local_10 = 1;
      break;
    case 0x32:
      local_10 = 2;
      break;
    case 0x33:
      local_10 = 3;
      break;
    case 0x34:
      local_10 = 4;
      break;
    case 0x35:
      local_10 = 5;
      break;
    case 0x36:
      local_10 = 6;
      break;
    case 0x37:
      local_10 = 7;
      break;
    case 0x38:
      local_10 = 8;
      break;
    case 0x39:
      local_10 = 9;
      break;
    default:
      *(undefined1 *)(in_RDI + 0x468) = 0;
      *(undefined1 *)(in_RDI + 0x469) = 0;
      return;
    }
    std::__cxx11::stringstream::stringstream(local_198);
    this_00 = (Application *)std::operator<<(local_188,"Scotty3D_buffer");
    filename_00 = (ostream *)std::ostream::operator<<(this_00,local_10);
    std::operator<<(filename_00,".dae");
    if ((*(byte *)(in_RDI + 0x468) & 1) == 0) {
      if ((*(byte *)(in_RDI + 0x469) & 1) != 0) {
        std::__cxx11::stringstream::str();
        std::__cxx11::string::c_str();
        loadScene(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
        std::__cxx11::string::~string(local_1e8);
      }
    }
    else {
      std::__cxx11::stringstream::str();
      std::__cxx11::string::c_str();
      writeScene(this_00,(char *)filename_00);
      std::__cxx11::string::~string(local_1c8);
    }
    *(undefined1 *)(in_RDI + 0x468) = 0;
    *(undefined1 *)(in_RDI + 0x469) = 0;
    std::__cxx11::stringstream::~stringstream(local_198);
  }
  return;
}

Assistant:

void Application::executeFileOp(int codepoint) {
  // If the user already pressed 'w' or 'l' (indicating that
  // they wanted to write or load a file) AND the next key
  // they pressed was a number, then we should go ahead and
  // write/load the file corresponding to the specified number.

  if (!readyLoad && !readyWrite) return;

  // Convert Unicode codepoint to integer.  (Probably a more
  // clever way to do this, but often a foolproof solution is
  // (much) better than a clever one...)
  int index = -1;
  switch (codepoint) {
    case '0':
      index = 0;
      break;
    case '1':
      index = 1;
      break;
    case '2':
      index = 2;
      break;
    case '3':
      index = 3;
      break;
    case '4':
      index = 4;
      break;
    case '5':
      index = 5;
      break;
    case '6':
      index = 6;
      break;
    case '7':
      index = 7;
      break;
    case '8':
      index = 8;
      break;
    case '9':
      index = 9;
      break;
    default:
      readyLoad = readyWrite = false;
      return;
      break;
  }

  stringstream filename;
  filename << "Scotty3D_buffer" << index << ".dae";

  if (readyWrite)
    writeScene(filename.str().c_str());
  else if (readyLoad)
    loadScene(filename.str().c_str());

  readyLoad = readyWrite = false;
}